

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 VmExecIncludedFile(jx9_context *pCtx,SyString *pPath,int IncludeOnce)

{
  sxu32 sVar1;
  jx9_vm *pVm;
  sxi32 sVar2;
  jx9_io_stream *pStream;
  void *pHandle;
  sxi32 sVar3;
  int bTrueReturn;
  int isNew;
  SyBlob sContents;
  SyString sScript;
  
  pVm = pCtx->pVm;
  sContents.pBlob = (void *)0x0;
  sContents.nByte = 0;
  sContents.mByte = 0;
  sContents.nFlags = 0;
  isNew = 0;
  sContents.pAllocator = &pVm->sAllocator;
  pStream = jx9VmGetStreamDevice(pVm,&pPath->zString,pPath->nByte);
  bTrueReturn = 1;
  pHandle = jx9StreamOpenHandle(pVm,pStream,pPath->zString,1,1,(jx9_value *)0x0,1,&isNew);
  if (pHandle == (void *)0x0) {
    sVar3 = -2;
  }
  else {
    if ((IncludeOnce == 0) || (sVar3 = -0xb, isNew != 0)) {
      sVar2 = jx9StreamReadWholeFile(pHandle,pStream,&sContents);
      sVar3 = -1;
      if (sVar2 == 0) {
        sScript.zString = (char *)sContents.pBlob;
        sScript.nByte = sContents.nByte;
        VmEvalChunk(pCtx->pVm,pCtx,&sScript,1,bTrueReturn);
        sVar3 = 0;
      }
    }
    sVar1 = (pVm->aFiles).nUsed;
    if (sVar1 != 0) {
      (pVm->aFiles).nUsed = sVar1 - 1;
    }
    if (pStream->xClose != (_func_void_void_ptr *)0x0) {
      (*pStream->xClose)(pHandle);
    }
    if (((sContents.nFlags & 6) == 0) && (sContents.mByte != 0)) {
      SyMemBackendFree(sContents.pAllocator,sContents.pBlob);
    }
  }
  return sVar3;
}

Assistant:

static sxi32 VmExecIncludedFile(
	 jx9_context *pCtx, /* Call Context */
	 SyString *pPath,   /* Script path or URL*/
	 int IncludeOnce    /* TRUE if called from import() or require_once() */
	 )
{
	sxi32 rc;
#ifndef JX9_DISABLE_BUILTIN_FUNC
	const jx9_io_stream *pStream;
	SyBlob sContents;
	void *pHandle;
	jx9_vm *pVm;
	int isNew;
	/* Initialize fields */
	pVm = pCtx->pVm;
	SyBlobInit(&sContents, &pVm->sAllocator);
	isNew = 0;
	/* Extract the associated stream */
	pStream = jx9VmGetStreamDevice(pVm, &pPath->zString, pPath->nByte);
	/*
	 * Open the file or the URL [i.e: http://jx9.symisc.net/example/hello.jx9.txt"] 
	 * in a read-only mode.
	 */
	pHandle = jx9StreamOpenHandle(pVm, pStream,pPath->zString, JX9_IO_OPEN_RDONLY, TRUE, 0, TRUE, &isNew);
	if( pHandle == 0 ){
		return SXERR_IO;
	}
	rc = SXRET_OK; /* Stupid cc warning */
	if( IncludeOnce && !isNew ){
		/* Already included */
		rc = SXERR_EXISTS;
	}else{
		/* Read the whole file contents */
		rc = jx9StreamReadWholeFile(pHandle, pStream, &sContents);
		if( rc == SXRET_OK ){
			SyString sScript;
			/* Compile and execute the script */
			SyStringInitFromBuf(&sScript, SyBlobData(&sContents), SyBlobLength(&sContents));
			VmEvalChunk(pCtx->pVm, &(*pCtx), &sScript, 0, TRUE);
		}
	}
	/* Pop from the set of included file */
	(void)SySetPop(&pVm->aFiles);
	/* Close the handle */
	jx9StreamCloseHandle(pStream, pHandle);
	/* Release the working buffer */
	SyBlobRelease(&sContents);
#else
	pCtx = 0; /* cc warning */
	pPath = 0;
	IncludeOnce = 0;
	rc = SXERR_IO;
#endif /* JX9_DISABLE_BUILTIN_FUNC */
	return rc;
}